

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_xorriso.c
# Opt level: O0

void test_read_format_iso_xorriso(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  char *pcVar5;
  la_int64_t lVar6;
  time_t tVar7;
  long v2;
  stat_conflict *psVar8;
  int local_3c;
  longlong lStack_38;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_2451e;
  extract_reference_file("test_read_format_iso_xorriso.iso.Z");
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                   ,L'L',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'M',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'N',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename((archive_conflict *)p,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'P',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'U',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'W',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'X',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    iVar1 = strcmp(".",pcVar5);
    if (iVar1 == 0) {
      mVar3 = archive_entry_filetype((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'\\',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar6 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L']',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
      tVar7 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'_',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'`',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      uVar4 = archive_entry_nlink((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'b',4,"4",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
      iVar1 = archive_read_data_block
                        ((archive *)p,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'd',1,"ARCHIVE_EOF",(long)iVar1,
                          "archive_read_data_block(a, &p, &size, &offset)",p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'e',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
    }
    else {
      pcVar5 = archive_entry_pathname((archive_entry *)a);
      iVar1 = strcmp("./dir",pcVar5);
      if (iVar1 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'h',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar6 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'i',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
        tVar7 = archive_entry_mtime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'j',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
        tVar7 = archive_entry_atime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'k',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        uVar4 = archive_entry_nlink((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'l',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
      }
      else {
        pcVar5 = archive_entry_pathname((archive_entry *)a);
        iVar1 = strcmp("./dir2",pcVar5);
        if (iVar1 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'o',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar6 = archive_entry_size((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'p',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
          tVar7 = archive_entry_mtime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'q',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
          tVar7 = archive_entry_atime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'r',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
          uVar4 = archive_entry_nlink((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L's',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
        }
        else {
          pcVar5 = archive_entry_pathname((archive_entry *)a);
          iVar1 = strcmp("./file",pcVar5);
          if (iVar1 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'w',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                                (void *)0x0);
            lVar6 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'x',6,"6",lVar6,"archive_entry_size(ae)",(void *)0x0);
            iVar1 = archive_read_data_block
                              ((archive *)p,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffc8);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'z',0,"0",(long)iVar1,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'{',0,"0",lStack_38,"offset",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'|',(void *)size,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
            tVar7 = archive_entry_mtime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'}',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
            tVar7 = archive_entry_atime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'~',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
            uVar4 = archive_entry_nlink((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'\x7f',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
          }
          else {
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            iVar1 = strcmp("./hardlink",pcVar5);
            if (iVar1 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x88',0x8000,"AE_IFREG",(ulong)mVar3,
                                  "archive_entry_filetype(ae)",(void *)0x0);
              pcVar5 = archive_entry_hardlink((archive_entry *)a);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                         ,L'\x89',"./file","\"./file\"",pcVar5,"archive_entry_hardlink(ae)",
                         (void *)0x0,L'\0');
              wVar2 = archive_entry_size_is_set((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x8a',0,"0",(long)wVar2,"archive_entry_size_is_set(ae)",
                                  (void *)0x0);
              lVar6 = archive_entry_size((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x8b',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
              tVar7 = archive_entry_mtime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x8c',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                  (void *)0x0);
              tVar7 = archive_entry_atime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x8d',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                  (void *)0x0);
              psVar8 = archive_entry_stat((archive_entry_conflict *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                  ,L'\x8e',2,"2",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink"
                                  ,(void *)0x0);
            }
            else {
              pcVar5 = archive_entry_pathname((archive_entry *)a);
              iVar1 = strcmp("./symlink",pcVar5);
              if (iVar1 == 0) {
                mVar3 = archive_entry_filetype((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                    ,L'\x92',0xa000,"AE_IFLNK",(ulong)mVar3,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                pcVar5 = archive_entry_symlink((archive_entry *)a);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                           ,L'\x93',"file","\"file\"",pcVar5,"archive_entry_symlink(ae)",(void *)0x0
                           ,L'\0');
                lVar6 = archive_entry_size((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                    ,L'\x94',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
                tVar7 = archive_entry_mtime((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                    ,L'\x95',0x2a302,"172802",tVar7,"archive_entry_mtime(ae)",
                                    (void *)0x0);
                tVar7 = archive_entry_atime((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                    ,L'\x96',0x2a302,"172802",tVar7,"archive_entry_atime(ae)",
                                    (void *)0x0);
                psVar8 = archive_entry_stat((archive_entry_conflict *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                    ,L'\x97',1,"1",psVar8->st_nlink,
                                    "archive_entry_stat(ae)->st_nlink",(void *)0x0);
              }
              else {
                pcVar5 = archive_entry_pathname((archive_entry *)a);
                iVar1 = strcmp("./empty",pcVar5);
                if (iVar1 == 0) {
                  mVar3 = archive_entry_filetype((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                      ,L'\x9b',0x8000,"AE_IFREG",(ulong)mVar3,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  lVar6 = archive_entry_size((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                      ,L'\x9c',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
                  tVar7 = archive_entry_mtime((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                      ,L'\x9d',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                      (void *)0x0);
                  tVar7 = archive_entry_atime((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                      ,L'\x9e',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                      (void *)0x0);
                  uVar4 = archive_entry_nlink((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                      ,L'\x9f',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",
                                      (void *)0x0);
                }
                else {
                  pcVar5 = archive_entry_pathname((archive_entry *)a);
                  iVar1 = strcmp("./dir/file2",pcVar5);
                  if (iVar1 == 0) {
                    mVar3 = archive_entry_filetype((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'£',0x8000,"AE_IFREG",(ulong)mVar3,
                                        "archive_entry_filetype(ae)",(void *)0x0);
                    lVar6 = archive_entry_size((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'¤',7,"7",lVar6,"archive_entry_size(ae)",(void *)0x0);
                    iVar1 = archive_read_data_block
                                      ((archive *)p,(void **)&size,(size_t *)&offset,
                                       &stack0xffffffffffffffc8);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'¦',0,"0",(long)iVar1,
                                        "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0
                                       );
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'§',0,"0",lStack_38,"offset",(void *)0x0);
                    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'¨',(void *)size,"p","hello2\n","\"hello2\\n\"",7,"7",
                                        (void *)0x0);
                    tVar7 = archive_entry_mtime((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'©',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                        (void *)0x0);
                    tVar7 = archive_entry_atime((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'ª',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                        (void *)0x0);
                    uVar4 = archive_entry_nlink((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                        ,L'«',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",
                                        (void *)0x0);
                  }
                  else {
                    pcVar5 = archive_entry_pathname((archive_entry *)a);
                    iVar1 = strcmp("./dir/file3",pcVar5);
                    if (iVar1 == 0) {
                      mVar3 = archive_entry_filetype((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'¯',0x8000,"AE_IFREG",(ulong)mVar3,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      lVar6 = archive_entry_size((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'°',7,"7",lVar6,"archive_entry_size(ae)",(void *)0x0);
                      iVar1 = archive_read_data_block
                                        ((archive *)p,(void **)&size,(size_t *)&offset,
                                         &stack0xffffffffffffffc8);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'²',0,"0",(long)iVar1,
                                          "archive_read_data_block(a, &p, &size, &offset)",
                                          (void *)0x0);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'³',0,"0",lStack_38,"offset",(void *)0x0);
                      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'´',(void *)size,"p","hello3\n","\"hello3\\n\"",7,"7",
                                          (void *)0x0);
                      tVar7 = archive_entry_mtime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'µ',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                          (void *)0x0);
                      tVar7 = archive_entry_atime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'¶',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                          (void *)0x0);
                      uVar4 = archive_entry_nlink((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                          ,L'·',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",
                                          (void *)0x0);
                    }
                    else {
                      pcVar5 = archive_entry_pathname((archive_entry *)a);
                      iVar1 = strcmp("./dir2/file4",pcVar5);
                      if (iVar1 == 0) {
                        mVar3 = archive_entry_filetype((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'»',0x8000,"AE_IFREG",(ulong)mVar3,
                                            "archive_entry_filetype(ae)",(void *)0x0);
                        lVar6 = archive_entry_size((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'¼',7,"7",lVar6,"archive_entry_size(ae)",(void *)0x0)
                        ;
                        iVar1 = archive_read_data_block
                                          ((archive *)p,(void **)&size,(size_t *)&offset,
                                           &stack0xffffffffffffffc8);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'¾',0,"0",(long)iVar1,
                                            "archive_read_data_block(a, &p, &size, &offset)",
                                            (void *)0x0);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'¿',0,"0",lStack_38,"offset",(void *)0x0);
                        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'À',(void *)size,"p","hello4\n","\"hello4\\n\"",7,"7"
                                            ,(void *)0x0);
                        tVar7 = archive_entry_mtime((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'Á',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",
                                            (void *)0x0);
                        tVar7 = archive_entry_atime((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'Â',0x15181,"86401",tVar7,"archive_entry_atime(ae)",
                                            (void *)0x0);
                        uVar4 = archive_entry_nlink((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                            ,L'Ã',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",
                                            (void *)0x0);
                      }
                      else {
                        failure("Saw a file that shouldn\'t have been there");
                        pcVar5 = archive_entry_pathname((archive_entry *)a);
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                   ,L'Æ',pcVar5,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,
                                   L'\0');
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'Ë',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code((archive *)p,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'Î',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'Ï',(long)iVar1,"archive_format(a)",0x40001,
                      "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
  iVar1 = archive_read_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'Ò',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'Ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_iso_xorriso)
{
	const char *refname = "test_read_format_iso_xorriso.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 10 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 10; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(4, archive_entry_nlink(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("./dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./dir2", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./file",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(6, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./hardlink",
		    archive_entry_pathname(ae)) == 0) {
			/* A hardlink to the regular file. */
			/* Note: If "hardlink" gets returned before "file",
			 * then "hardlink" will get returned as a regular file
			 * and "file" will get returned as the hardlink.
			 * This test should tolerate that, since it's a
			 * perfectly permissible thing for libarchive to do. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualString("./file", archive_entry_hardlink(ae));
			assertEqualInt(0, archive_entry_size_is_set(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
		} else if (strcmp("./symlink",
		    archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
		} else if (strcmp("./empty",
		    archive_entry_pathname(ae)) == 0) {
			/* A empty file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir/file2",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello2\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir/file3",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello3\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir2/file4",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello4\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}